

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  byte bVar1;
  long lVar2;
  BaseNode *pBVar3;
  BaseNode *pBVar4;
  undefined8 *puVar5;
  BaseCompiler *pBVar6;
  FuncNode *pFVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  Error EVar11;
  BaseBuilder *pBVar12;
  RABlock *pRVar13;
  long lVar14;
  BaseNode *pBVar15;
  InstNode *pIVar16;
  bool bVar17;
  FuncFrame *frame;
  EVP_PKEY_CTX *ctx;
  BaseRAPass *this_00;
  uint uVar18;
  RABlock *block;
  uint uVar19;
  uint uVar20;
  RALocalAllocator lra;
  RABlock *local_168;
  int local_14c;
  undefined1 local_130 [80];
  uint local_e0;
  uint local_dc;
  BaseRAPass *local_d0;
  PhysToWorkMap *local_c8;
  RABlock *local_58;
  
  local_130._8_8_ = (this->super_FuncPass).super_Pass._cb;
  local_130._16_8_ = this->_archTraits;
  local_130._24_8_ = *(undefined8 *)(this->_availableRegs)._masks._data;
  local_130._32_8_ = *(undefined8 *)((this->_availableRegs)._masks._data + 2);
  ctx = (EVP_PKEY_CTX *)0x0;
  local_130._0_8_ = this;
  memset(local_130 + 0x28,0,0xd8);
  local_130._56_8_ = *(undefined8 *)(this->_func->_frame)._preservedRegs._data;
  local_130._64_8_ = *(undefined8 *)((this->_func->_frame)._preservedRegs._data + 2);
  this_00 = (BaseRAPass *)local_130;
  EVar11 = RALocalAllocator::init((RALocalAllocator *)this_00,ctx);
  if ((EVar11 == 0) && (EVar11 = 0, *(int *)&this->field_0xb8 != 0)) {
    block = (RABlock *)**(undefined8 **)&this->_blocks;
    if (((byte)block[0xc] & 2) == 0) {
LAB_00126b57:
      runLocalAllocator();
LAB_00126b5c:
      runLocalAllocator();
LAB_00126b61:
      runLocalAllocator();
      pBVar6 = (BaseCompiler *)(this_00->super_FuncPass).super_Pass._cb;
      pFVar7 = this_00->_func;
      (pBVar6->super_BaseBuilder)._cursor = (BaseNode *)pFVar7;
      frame = &pFVar7->_frame;
      EVar11 = BaseEmitter::emitProlog((BaseEmitter *)pBVar6,frame);
      if ((EVar11 == 0) &&
         (EVar11 = BaseEmitHelper::emitArgsAssignment
                             (this_00->_iEmitHelper,frame,&this_00->_argsAssignment), EVar11 == 0))
      {
        pBVar6 = (BaseCompiler *)(this_00->super_FuncPass).super_Pass._cb;
        (pBVar6->super_BaseBuilder)._cursor = (BaseNode *)this_00->_func->_exitNode;
        EVar11 = BaseEmitter::emitEpilog((BaseEmitter *)pBVar6,frame);
      }
      return EVar11;
    }
    local_14c = *(int *)&this->field_0xd8;
    RALocalAllocator::makeInitialAssignment((RALocalAllocator *)local_130);
    this_00 = this;
    EVar11 = setBlockEntryAssignment(this,block,block,(RAAssignment *)(local_130 + 0x48));
    if (EVar11 == 0) {
      uVar20 = 0;
      do {
        do {
          pBVar15 = *(BaseNode **)(block + 0x10);
          uVar18 = *(uint *)(block + 0xc);
          pIVar16 = (InstNode *)0x0;
          if ((uVar18 >> 8 & 1) != 0) {
            pIVar16 = *(InstNode **)(block + 0x18);
          }
          lVar2 = *(long *)pBVar15;
          pBVar3 = *(BaseNode **)(*(InstNode **)(block + 0x18) + 8);
          local_58 = block;
          if (*(int *)(block + 0x70) == 0) {
            *(uint *)(block + 0xc) = uVar18 | 8;
            if (pBVar15 != pBVar3) {
              local_168 = (RABlock *)0x0;
              goto LAB_0012682a;
            }
LAB_001269ab:
            local_168 = (RABlock *)0x0;
            bVar17 = true;
          }
          else {
            local_168 = (RABlock *)**(long **)(block + 0x68);
            *(uint *)(block + 0xc) = uVar18 | 8;
            if (pBVar15 == pBVar3) {
              if (local_168 == (RABlock *)0x0) goto LAB_001269ab;
              pBVar12 = (this->super_FuncPass).super_Pass._cb;
              pBVar15 = (BaseNode *)&pBVar12->field_0x1a8;
              if (pBVar3 != (BaseNode *)0x0) {
                pBVar15 = pBVar3;
              }
LAB_00126921:
              pBVar15 = *(BaseNode **)pBVar15;
            }
            else {
LAB_0012682a:
              bVar17 = false;
              do {
                pBVar4 = *(BaseNode **)((InstNode *)pBVar15 + 8);
                if (((byte)((InstNode *)pBVar15)[0x11] & 0x20) != 0) {
                  bVar10 = bVar17;
                  if (pBVar15 == (BaseNode *)pIVar16) {
                    uVar18 = *(uint *)(block + 0x70);
                    if (((byte)block[0xd] & 2) == 0) {
                      bVar10 = true;
                      if (uVar18 < 2) goto LAB_0012684c;
                      this_00 = (BaseRAPass *)local_130;
                      EVar11 = RALocalAllocator::allocJumpTable
                                         ((RALocalAllocator *)this_00,(InstNode *)pBVar15,
                                          (RABlocks *)(block + 0x68),(RABlock *)0x0);
                    }
                    else {
                      if (uVar18 == 0) goto LAB_00126b61;
                      puVar5 = *(undefined8 **)(block + 0x68);
                      this_00 = (BaseRAPass *)local_130;
                      EVar11 = RALocalAllocator::allocBranch
                                         ((RALocalAllocator *)this_00,(InstNode *)pBVar15,
                                          (RABlock *)puVar5[uVar18 - 1],(RABlock *)*puVar5);
                    }
                  }
                  else {
LAB_0012684c:
                    bVar17 = bVar10;
                    EVar11 = RALocalAllocator::allocInst
                                       ((RALocalAllocator *)local_130,(InstNode *)pBVar15);
                    if (EVar11 != 0) {
                      return EVar11;
                    }
                    if (((InstNode *)pBVar15)[0x10] == (InstNode)0x12) {
                      this_00 = this;
                      EVar11 = (*(this->super_FuncPass).super_Pass._vptr_Pass[0xe])(this,pBVar15);
                    }
                    else {
                      this_00 = (BaseRAPass *)local_130;
                      EVar11 = RALocalAllocator::spillAfterAllocation
                                         ((RALocalAllocator *)this_00,(InstNode *)pBVar15);
                    }
                  }
                  if (EVar11 != 0) {
                    return EVar11;
                  }
                }
                pBVar15 = pBVar4;
              } while (pBVar4 != pBVar3);
              if (local_168 == (RABlock *)0x0) goto LAB_001269ab;
              pBVar12 = (this->super_FuncPass).super_Pass._cb;
              pBVar15 = (BaseNode *)&pBVar12->field_0x1a8;
              if (pBVar3 != (BaseNode *)0x0) {
                pBVar15 = pBVar3;
              }
              pBVar15 = *(BaseNode **)pBVar15;
              if (bVar17) goto LAB_00126921;
            }
            pBVar12->_cursor = pBVar15;
            if (*(PhysToWorkMap **)(local_168 + 200) == (PhysToWorkMap *)0x0) {
              uVar18 = *(uint *)(local_168 + 0xb8);
              if ((ulong)uVar18 == 0xffffffff) {
                pRVar13 = local_168 + 0xbc;
              }
              else {
                if (*(uint *)(*(long *)local_168 + 0xf0) <= uVar18) goto LAB_00126b5c;
                pRVar13 = (RABlock *)((ulong)uVar18 * 0x20 + *(long *)(*(long *)local_168 + 0xe8));
              }
              EVar11 = RALocalAllocator::spillScratchGpRegsBeforeEntry
                                 ((RALocalAllocator *)local_130,*(RegMask *)pRVar13);
              if (EVar11 != 0) {
                return EVar11;
              }
              EVar11 = setBlockEntryAssignment
                                 (this,local_168,block,(RAAssignment *)(local_130 + 0x48));
              if (EVar11 != 0) {
                return EVar11;
              }
              memcpy(local_c8,*(void **)(local_168 + 200),(ulong)local_e0 * 4 + 0x20);
              this_00 = local_d0;
              memset(local_d0,0xff,(ulong)local_dc);
              lVar14 = 0;
              do {
                uVar18 = (local_c8->assigned)._masks._data[lVar14];
                if (uVar18 != 0) {
                  bVar1 = local_130[lVar14 + 0x48];
                  do {
                    iVar8 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                      }
                    }
                    this_00 = (BaseRAPass *)(ulong)local_c8->workIds[iVar8 + (uint)bVar1];
                    if (this_00 == (BaseRAPass *)0xffffffff) {
                      runLocalAllocator();
                      goto LAB_00126b34;
                    }
                    *(char *)((long)&(local_d0->super_FuncPass).super_Pass._vptr_Pass +
                             (long)this_00) = (char)iVar8;
                    uVar18 = uVar18 - 1 & uVar18;
                  } while (uVar18 != 0);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 4);
              bVar17 = false;
            }
            else {
              bVar17 = false;
              this_00 = (BaseRAPass *)local_130;
              EVar11 = RALocalAllocator::switchToAssignment
                                 ((RALocalAllocator *)this_00,*(PhysToWorkMap **)(local_168 + 200),
                                  (ZoneBitVector *)(local_168 + 0x78),
                                  SUB41((*(uint *)(local_168 + 0xc) & 8) >> 3,0),false);
              if (EVar11 != 0) {
                return EVar11;
              }
            }
          }
          *(undefined8 *)(block + 0x10) = *(undefined8 *)(lVar2 + 8);
          pBVar15 = (BaseNode *)&((this->super_FuncPass).super_Pass._cb)->field_0x1a8;
          if (pBVar3 != (BaseNode *)0x0) {
            pBVar15 = pBVar3;
          }
          *(long *)(block + 0x18) = *(long *)pBVar15;
          local_14c = local_14c + -1;
          if (local_14c == 0) {
LAB_00126b34:
            uVar9 = *(ulong *)((this->_clobberedRegs)._masks._data + 2);
            *(ulong *)(this->_clobberedRegs)._masks._data =
                 local_130._40_8_ | *(ulong *)(this->_clobberedRegs)._masks._data;
            *(ulong *)((this->_clobberedRegs)._masks._data + 2) = local_130._48_8_ | uVar9;
            return 0;
          }
        } while ((!bVar17) && (block = local_168, ((byte)local_168[0xc] & 8) == 0));
        uVar18 = *(uint *)&this->field_0xb8;
        uVar19 = uVar20 + 1;
        if (uVar18 <= uVar20 + 1) {
          uVar19 = 0;
        }
        if (uVar18 <= uVar19) {
          runLocalAllocator();
          goto LAB_00126b57;
        }
        uVar20 = uVar19;
        while ((block = *(RABlock **)(*(long *)&this->_blocks + (ulong)uVar20 * 8),
               (*(uint *)(block + 0xc) & 10) != 2 ||
               (*(PhysToWorkMap **)(block + 200) == (PhysToWorkMap *)0x0))) {
          uVar20 = uVar20 + 1;
          if (uVar18 <= uVar20) {
            uVar20 = 0;
          }
        }
        this_00 = (BaseRAPass *)local_130;
        RALocalAllocator::replaceAssignment
                  ((RALocalAllocator *)this_00,*(PhysToWorkMap **)(block + 200));
      } while( true );
    }
  }
  return EVar11;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however, the algorithm also allows to jump to
  // any other block when finished if it's a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == NodeType::kInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(lra.switchToAssignment(consecutive->entryPhysToWorkMap(), consecutive->liveIn(), consecutive->isAllocated(), false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}